

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O0

void array_reverse_transpose_8x8(v128 *in,v128 *res)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  v128 tr0_7;
  v128 tr0_6;
  v128 tr0_5;
  v128 tr0_4;
  v128 tr0_3;
  v128 tr0_2;
  v128 tr0_1;
  v128 tr0_0;
  v128 tr1_7;
  v128 tr1_6;
  v128 tr1_5;
  v128 tr1_4;
  v128 tr1_3;
  v128 tr1_2;
  v128 tr1_1;
  v128 tr1_0;
  
  auVar5 = vpunpcklwd_avx(*in_RDI,in_RDI[1]);
  auVar6 = vpunpcklwd_avx(in_RDI[2],in_RDI[3]);
  auVar1 = vpunpckhwd_avx(*in_RDI,in_RDI[1]);
  auVar2 = vpunpckhwd_avx(in_RDI[2],in_RDI[3]);
  auVar7 = vpunpcklwd_avx(in_RDI[4],in_RDI[5]);
  auVar8 = vpunpcklwd_avx(in_RDI[6],in_RDI[7]);
  auVar3 = vpunpckhwd_avx(in_RDI[4],in_RDI[5]);
  auVar4 = vpunpckhwd_avx(in_RDI[6],in_RDI[7]);
  auVar9 = vpunpckldq_avx(auVar5,auVar6);
  auVar10 = vpunpckldq_avx(auVar7,auVar8);
  auVar5 = vpunpckhdq_avx(auVar5,auVar6);
  auVar6 = vpunpckhdq_avx(auVar7,auVar8);
  auVar7 = vpunpckldq_avx(auVar1,auVar2);
  auVar8 = vpunpckldq_avx(auVar3,auVar4);
  auVar1 = vpunpckhdq_avx(auVar1,auVar2);
  auVar2 = vpunpckhdq_avx(auVar3,auVar4);
  auVar3 = vpunpcklqdq_avx(auVar9,auVar10);
  in_RSI[7] = auVar3;
  auVar3 = vpunpckhqdq_avx(auVar9,auVar10);
  in_RSI[6] = auVar3;
  auVar3 = vpunpcklqdq_avx(auVar5,auVar6);
  in_RSI[5] = auVar3;
  auVar3 = vpunpckhqdq_avx(auVar5,auVar6);
  in_RSI[4] = auVar3;
  auVar3 = vpunpcklqdq_avx(auVar7,auVar8);
  in_RSI[3] = auVar3;
  auVar3 = vpunpckhqdq_avx(auVar7,auVar8);
  in_RSI[2] = auVar3;
  auVar3 = vpunpcklqdq_avx(auVar1,auVar2);
  in_RSI[1] = auVar3;
  auVar1 = vpunpckhqdq_avx(auVar1,auVar2);
  *in_RSI = auVar1;
  return;
}

Assistant:

static inline void array_reverse_transpose_8x8(v128 *in, v128 *res) {
  const v128 tr0_0 = v128_ziplo_16(in[1], in[0]);
  const v128 tr0_1 = v128_ziplo_16(in[3], in[2]);
  const v128 tr0_2 = v128_ziphi_16(in[1], in[0]);
  const v128 tr0_3 = v128_ziphi_16(in[3], in[2]);
  const v128 tr0_4 = v128_ziplo_16(in[5], in[4]);
  const v128 tr0_5 = v128_ziplo_16(in[7], in[6]);
  const v128 tr0_6 = v128_ziphi_16(in[5], in[4]);
  const v128 tr0_7 = v128_ziphi_16(in[7], in[6]);

  const v128 tr1_0 = v128_ziplo_32(tr0_1, tr0_0);
  const v128 tr1_1 = v128_ziplo_32(tr0_5, tr0_4);
  const v128 tr1_2 = v128_ziphi_32(tr0_1, tr0_0);
  const v128 tr1_3 = v128_ziphi_32(tr0_5, tr0_4);
  const v128 tr1_4 = v128_ziplo_32(tr0_3, tr0_2);
  const v128 tr1_5 = v128_ziplo_32(tr0_7, tr0_6);
  const v128 tr1_6 = v128_ziphi_32(tr0_3, tr0_2);
  const v128 tr1_7 = v128_ziphi_32(tr0_7, tr0_6);

  res[7] = v128_ziplo_64(tr1_1, tr1_0);
  res[6] = v128_ziphi_64(tr1_1, tr1_0);
  res[5] = v128_ziplo_64(tr1_3, tr1_2);
  res[4] = v128_ziphi_64(tr1_3, tr1_2);
  res[3] = v128_ziplo_64(tr1_5, tr1_4);
  res[2] = v128_ziphi_64(tr1_5, tr1_4);
  res[1] = v128_ziplo_64(tr1_7, tr1_6);
  res[0] = v128_ziphi_64(tr1_7, tr1_6);
}